

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O2

int decrypt_and_print(ptls_t *tls,uint8_t *input,size_t inlen)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  size_t consumed;
  ptls_buffer_t decryptbuf;
  uint8_t decryptbuf_small [1024];
  
  decryptbuf.base = decryptbuf_small;
  decryptbuf.off = 0;
  decryptbuf.capacity = 0x400;
  decryptbuf.is_allocated = 0;
  while( true ) {
    if (inlen == 0) {
      ptls_buffer_dispose(&decryptbuf);
      return 0;
    }
    consumed = inlen;
    uVar2 = ptls_receive(tls,&decryptbuf,input,&consumed);
    sVar1 = consumed;
    if (uVar2 != 0) break;
    if (decryptbuf.off != 0) {
      iVar3 = write_all(1,decryptbuf.base,decryptbuf.off);
      if (iVar3 != 0) {
        return -1;
      }
      decryptbuf.off = 0;
    }
    input = input + sVar1;
    inlen = inlen - sVar1;
  }
  fprintf(_stderr,"ptls_receive:%d\n",(ulong)uVar2);
  return -1;
}

Assistant:

static int decrypt_and_print(ptls_t *tls, const uint8_t *input, size_t inlen)
{
    ptls_buffer_t decryptbuf;
    uint8_t decryptbuf_small[1024];
    int ret;

    ptls_buffer_init(&decryptbuf, decryptbuf_small, sizeof(decryptbuf_small));

    while (inlen != 0) {
        size_t consumed = inlen;
        if ((ret = ptls_receive(tls, &decryptbuf, input, &consumed)) != 0) {
            fprintf(stderr, "ptls_receive:%d\n", ret);
            return -1;
        }
        input += consumed;
        inlen -= consumed;
        if (decryptbuf.off != 0) {
            if (write_all(1, decryptbuf.base, decryptbuf.off) != 0)
                return -1;
            decryptbuf.off = 0;
        }
    }

    ptls_buffer_dispose(&decryptbuf);
    return 0;
}